

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idefs.h
# Opt level: O2

Am_Input_Char * __thiscall Am_Input_Char::operator=(Am_Input_Char *this,Am_Value *value)

{
  long lVar1;
  
  if (value->type == Am_Input_Char_ID) {
    lVar1 = (value->value).long_value;
    this->code = (short)lVar1;
    *(ushort *)&this->field_0x2 =
         (ushort)((ulong)lVar1 >> 0x10) & 0xfff | *(ushort *)&this->field_0x2 & 0xf000;
    return this;
  }
  Am_Error();
}

Assistant:

Am_Input_Char &operator=(const Am_Value &value)
  {
    if (value.type != Am_Input_Char_ID) {
#ifdef DEBUG
      Am_Error(
          "** Tried to set an Am_Input_Char with a non Am_Input_Char wrapper.");
#else
      Am_Error();
#endif
    }

    long l = value.value.long_value;
    short low_bytes = (short)l;
    short high_bytes = (short)(l >> 16);

    code = low_bytes;
    shift = (high_bytes & AmShiftMask);
    control = (high_bytes & AmControlMask) >> 1;
    meta = (high_bytes & AmMetaMask) >> 2;
    any_modifier = (high_bytes & AmAnyModMask) >> 3;
    button_down = (Am_Button_Down)((high_bytes & AmBDownMask) >> 4);
    click_count = (Am_Click_Count)((high_bytes & AmCCountMask) >> 8);

    return (*this);
  }